

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O1

ssize_t http2_handle_stream_close(connectdata *conn,Curl_easy *data,HTTP *stream,CURLcode *err)

{
  undefined1 *puVar1;
  char ***pppcVar2;
  uint32_t error_code;
  uint uVar3;
  int iVar4;
  CURLcode CVar5;
  size_t sVar6;
  char *pcVar7;
  char *pcVar8;
  char cVar9;
  char *pcVar10;
  bool bVar11;
  
  if ((conn->proto).httpc.pause_stream_id == stream->stream_id) {
    (conn->proto).httpc.pause_stream_id = 0;
  }
  pppcVar2 = &(conn->proto).ftpc.dirs;
  *pppcVar2 = (char **)((long)*pppcVar2 - (data->state).drain);
  (data->state).drain = 0;
  if (((conn->proto).httpc.pause_stream_id == 0) &&
     (iVar4 = h2_process_pending_input(data,&(conn->proto).httpc,err), iVar4 != 0)) {
    return -1;
  }
  stream->closed = false;
  error_code = stream->error;
  if (error_code == 0) {
    if (stream->bodystarted != false) {
      sVar6 = Curl_dyn_len(&stream->trailer_recvbuf);
      if (sVar6 != 0) {
        pcVar8 = Curl_dyn_ptr(&stream->trailer_recvbuf);
        do {
          pcVar7 = strchr(pcVar8,10);
          if (pcVar7 == (char *)0x0) {
            cVar9 = '\x06';
            bVar11 = false;
          }
          else {
            pcVar10 = pcVar7 + 1;
            Curl_debug(data,CURLINFO_HEADER_IN,pcVar8,(long)pcVar10 - (long)pcVar8);
            CVar5 = Curl_client_write(data,2,pcVar8,(long)pcVar10 - (long)pcVar8);
            bVar11 = CVar5 == CURLE_OK;
            if (!bVar11) {
              *err = CVar5;
              pcVar10 = pcVar8;
            }
            cVar9 = !bVar11;
            pcVar8 = pcVar10;
          }
          if (cVar9 != '\0') {
            if ((cVar9 != '\x06') && (!bVar11)) {
              return -1;
            }
            break;
          }
        } while (pcVar7 != (char *)0x0);
      }
      stream->close_handled = true;
      return 0;
    }
    Curl_failf(data,
               "HTTP/2 stream %u was closed cleanly, but before getting  all response header fields, treated as error"
               ,(ulong)(uint)stream->stream_id);
  }
  else {
    if (error_code == 7) {
      Curl_conncontrol(conn,1);
      puVar1 = &(data->state).field_0x6d0;
      *puVar1 = *puVar1 | 4;
      *err = CURLE_RECV_ERROR;
      return -1;
    }
    uVar3 = stream->stream_id;
    pcVar8 = nghttp2_http2_strerror(error_code);
    Curl_failf(data,"HTTP/2 stream %u was not closed cleanly: %s (err %u)",(ulong)uVar3,pcVar8,
               (ulong)stream->error);
  }
  *err = CURLE_HTTP2_STREAM;
  return -1;
}

Assistant:

static ssize_t http2_handle_stream_close(struct connectdata *conn,
                                         struct Curl_easy *data,
                                         struct HTTP *stream, CURLcode *err)
{
  struct http_conn *httpc = &conn->proto.httpc;

  if(httpc->pause_stream_id == stream->stream_id) {
    httpc->pause_stream_id = 0;
  }

  drained_transfer(data, httpc);

  if(httpc->pause_stream_id == 0) {
    if(h2_process_pending_input(data, httpc, err) != 0) {
      return -1;
    }
  }

  DEBUGASSERT(data->state.drain == 0);

  /* Reset to FALSE to prevent infinite loop in readwrite_data function. */
  stream->closed = FALSE;
  if(stream->error == NGHTTP2_REFUSED_STREAM) {
    H2BUGF(infof(data, "REFUSED_STREAM (%u), try again on a new connection",
                 stream->stream_id));
    connclose(conn, "REFUSED_STREAM"); /* don't use this anymore */
    data->state.refused_stream = TRUE;
    *err = CURLE_RECV_ERROR; /* trigger Curl_retry_request() later */
    return -1;
  }
  else if(stream->error != NGHTTP2_NO_ERROR) {
    failf(data, "HTTP/2 stream %u was not closed cleanly: %s (err %u)",
          stream->stream_id, nghttp2_http2_strerror(stream->error),
          stream->error);
    *err = CURLE_HTTP2_STREAM;
    return -1;
  }

  if(!stream->bodystarted) {
    failf(data, "HTTP/2 stream %u was closed cleanly, but before getting "
          " all response header fields, treated as error",
          stream->stream_id);
    *err = CURLE_HTTP2_STREAM;
    return -1;
  }

  if(Curl_dyn_len(&stream->trailer_recvbuf)) {
    char *trailp = Curl_dyn_ptr(&stream->trailer_recvbuf);
    char *lf;

    do {
      size_t len = 0;
      CURLcode result;
      /* each trailer line ends with a newline */
      lf = strchr(trailp, '\n');
      if(!lf)
        break;
      len = lf + 1 - trailp;

      Curl_debug(data, CURLINFO_HEADER_IN, trailp, len);
      /* pass the trailers one by one to the callback */
      result = Curl_client_write(data, CLIENTWRITE_HEADER, trailp, len);
      if(result) {
        *err = result;
        return -1;
      }
      trailp = ++lf;
    } while(lf);
  }

  stream->close_handled = TRUE;

  H2BUGF(infof(data, "http2_recv returns 0, http2_handle_stream_close"));
  return 0;
}